

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

PortDeclarationSyntax * __thiscall
slang::parsing::Parser::parsePortDeclaration(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token semi_00;
  bool bVar1;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *this_00;
  PortDeclarationSyntax *pPVar2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDI;
  Token TVar3;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar4;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> declarators;
  Token semi;
  PortHeaderSyntax *header;
  undefined1 in_stack_00000100 [16];
  Token in_stack_00000110;
  Token direction;
  Token constKeyword;
  ParserBase *in_stack_fffffffffffffea8;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators_00;
  Parser *in_stack_fffffffffffffeb0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffec0;
  ParserBase *in_stack_fffffffffffffed0;
  Info *local_a0;
  SyntaxFactory *local_90;
  undefined8 local_88;
  TokenKind local_48;
  
  ParserBase::consumeIf
            (&in_stack_fffffffffffffeb0->super_ParserBase,
             (TokenKind)((ulong)in_stack_fffffffffffffea8 >> 0x30));
  Token::Token((Token *)in_stack_fffffffffffffeb0);
  TVar3 = ParserBase::peek(in_stack_fffffffffffffea8);
  local_48 = TVar3.kind;
  bVar1 = slang::syntax::SyntaxFacts::isPortDirection(local_48);
  if (bVar1) {
    ParserBase::consume(in_stack_fffffffffffffed0);
  }
  this_00 = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)
            parsePortHeader((Parser *)header,in_stack_00000110,(Token)in_stack_00000100);
  Token::Token((Token *)in_stack_fffffffffffffeb0);
  sVar4 = parseDeclarators(in_stack_fffffffffffffeb0,(Token *)in_stack_fffffffffffffea8,false,false)
  ;
  declarators_00 = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)(in_RDI + 4);
  elements._M_extent._M_extent_value = in_stack_fffffffffffffec0._M_extent_value;
  elements._M_ptr = (pointer)in_RDI;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffeb0,
             elements);
  local_a0 = (Info *)sVar4._M_ptr;
  sVar4._M_extent._M_extent_value = in_stack_fffffffffffffec0._M_extent_value;
  sVar4._M_ptr = (pointer)in_RDI;
  slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::SeparatedSyntaxList
            (this_00,sVar4);
  semi_00.info = local_a0;
  semi_00._0_8_ = local_88;
  pPVar2 = slang::syntax::SyntaxFactory::portDeclaration
                     (local_90,in_RDI,(PortHeaderSyntax *)this_00,declarators_00,semi_00);
  return pPVar2;
}

Assistant:

PortDeclarationSyntax& Parser::parsePortDeclaration(AttrList attributes) {
    Token constKeyword = consumeIf(TokenKind::ConstKeyword);
    Token direction;
    if (isPortDirection(peek().kind))
        direction = consume();

    // Callers must ensure we don't call with 'const' unless also 'ref'.
    SLANG_ASSERT(!constKeyword || direction.kind == TokenKind::RefKeyword);

    auto& header = parsePortHeader(constKeyword, direction);

    Token semi;
    auto declarators = parseDeclarators(semi);
    return factory.portDeclaration(attributes, header, declarators, semi);
}